

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinifile.c
# Opt level: O0

pboolean p_ini_file_parameter_boolean(PIniFile *file,pchar *section,pchar *key,pboolean default_val)

{
  int iVar1;
  pchar *__s1;
  uint local_3c;
  pboolean ret;
  pchar *val;
  pboolean default_val_local;
  pchar *key_local;
  pchar *section_local;
  PIniFile *file_local;
  
  __s1 = pp_ini_file_find_parameter(file,section,key);
  file_local._4_4_ = default_val;
  if (__s1 != (pchar *)0x0) {
    iVar1 = strcmp(__s1,"true");
    if ((iVar1 == 0) || (iVar1 = strcmp(__s1,"TRUE"), iVar1 == 0)) {
      local_3c = 1;
    }
    else {
      iVar1 = strcmp(__s1,"false");
      if ((iVar1 == 0) || (iVar1 = strcmp(__s1,"FALSE"), iVar1 == 0)) {
        local_3c = 0;
      }
      else {
        iVar1 = atoi(__s1);
        local_3c = (uint)(0 < iVar1);
      }
    }
    p_free(__s1);
    file_local._4_4_ = local_3c;
  }
  return file_local._4_4_;
}

Assistant:

P_LIB_API pboolean
p_ini_file_parameter_boolean (const PIniFile	*file,
			      const pchar	*section,
			      const pchar	*key,
			      pboolean		default_val)
{
	pchar		*val;
	pboolean	ret;

	if ((val = pp_ini_file_find_parameter (file, section, key)) == NULL)
		return default_val;

	if (strcmp (val, "true") == 0 || strcmp (val, "TRUE") == 0)
		ret = TRUE;
	else if (strcmp (val, "false") == 0 || strcmp (val, "FALSE") == 0)
		ret = FALSE;
	else if (atoi (val) > 0)
		ret = TRUE;
	else
		ret = FALSE;

	p_free (val);

	return ret;
}